

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_exception.h
# Opt level: O2

void __thiscall binpac::Exception::Exception(Exception *this,char *m)

{
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"binpac exception: ",&local_31);
  if (m != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>(local_30,m,&local_31);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

Exception(const char* m = 0) : msg_("binpac exception: ")
		{
		if ( m )
			append(m);
		// abort();
		}